

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldGeneratorInfo *pFVar2;
  ImmutableFieldGenerator *pIVar3;
  OneofGeneratorInfo *pOVar4;
  Descriptor *pDVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  undefined8 extraout_RDX_02;
  long lVar7;
  char *text;
  FieldDescriptor *pFVar8;
  long lVar9;
  long lVar10;
  string local_50;
  
  io::Printer::Print(printer,
                     "@java.lang.Override\npublic boolean equals(final java.lang.Object obj) {\n");
  io::Printer::Indent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_50,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,
                     "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
                     ,"classname",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(printer,"boolean result = true;\n");
  pDVar5 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    lVar7 = 0;
    lVar10 = 0;
    do {
      if (*(long *)(*(long *)(pDVar5 + 0x30) + 0x60 + lVar7) == 0) {
        pFVar8 = (FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar7);
        pFVar2 = Context::GetFieldGeneratorInfo(this->context_,pFVar8);
        bVar1 = anon_unknown_19::CheckHasBitsForEqualsAndHashCode(pFVar8);
        if (bVar1) {
          io::Printer::Print(printer,
                             "result = result && (has$name$() == other.has$name$());\nif (has$name$()) {\n"
                             ,"name",&pFVar2->capitalized_name);
          io::Printer::Indent(printer);
          pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,pFVar8);
          (*pIVar3->_vptr_ImmutableFieldGenerator[0x11])(pIVar3,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
        }
        else {
          pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,pFVar8);
          (*pIVar3->_vptr_ImmutableFieldGenerator[0x11])(pIVar3,printer);
        }
      }
      lVar10 = lVar10 + 1;
      pDVar5 = (this->super_MessageGenerator).descriptor_;
      lVar7 = lVar7 + 0xa8;
    } while (lVar10 < *(int *)(pDVar5 + 0x2c));
  }
  pDVar5 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar5 + 0x38)) {
    lVar7 = 0;
    do {
      lVar9 = lVar7 * 0x30;
      pOVar4 = Context::GetOneofGeneratorInfo
                         (this->context_,(OneofDescriptor *)(*(long *)(pDVar5 + 0x40) + lVar9));
      io::Printer::Print(printer,
                         "result = result && get$oneof_capitalized_name$Case().equals(\n    other.get$oneof_capitalized_name$Case());\n"
                         ,"oneof_capitalized_name",&pOVar4->capitalized_name);
      pOVar4 = Context::GetOneofGeneratorInfo
                         (this->context_,
                          (OneofDescriptor *)
                          (*(long *)((this->super_MessageGenerator).descriptor_ + 0x40) + lVar9));
      io::Printer::Print(printer,"if (!result) return false;\nswitch ($oneof_name$Case_) {\n",
                         "oneof_name",&pOVar4->name);
      io::Printer::Indent(printer);
      lVar10 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x40);
      if (0 < *(int *)(lVar10 + 0x1c + lVar9)) {
        lVar9 = 0;
        uVar6 = extraout_RDX;
        do {
          pFVar8 = *(FieldDescriptor **)(*(long *)(lVar10 + 0x20 + lVar7 * 0x30) + lVar9 * 8);
          SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(pFVar8 + 0x38),(int)uVar6);
          io::Printer::Print(printer,"case $field_number$:\n","field_number",&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,pFVar8);
          (*pIVar3->_vptr_ImmutableFieldGenerator[0x11])(pIVar3,printer);
          io::Printer::Print(printer,"break;\n");
          io::Printer::Outdent(printer);
          lVar9 = lVar9 + 1;
          lVar10 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x40);
          uVar6 = extraout_RDX_00;
        } while (lVar9 < *(int *)(lVar10 + 0x1c + lVar7 * 0x30));
      }
      io::Printer::Print(printer,"case 0:\ndefault:\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      lVar7 = lVar7 + 1;
      pDVar5 = (this->super_MessageGenerator).descriptor_;
    } while (lVar7 < *(int *)(pDVar5 + 0x38));
  }
  if (*(int *)(*(long *)(pDVar5 + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,"result = result && unknownFields.equals(other.unknownFields);\n");
  }
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x68)) {
    io::Printer::Print(printer,
                       "result = result &&\n    getExtensionFields().equals(other.getExtensionFields());\n"
                      );
  }
  io::Printer::Print(printer,"return result;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  io::Printer::Print(printer,"@java.lang.Override\npublic int hashCode() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"if (memoizedHashCode != 0) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"return memoizedHashCode;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\nint hash = 41;\n");
  text = "hash = (19 * hash) + getDescriptor().hashCode();\n";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x69) != '\0') {
    text = "hash = (19 * hash) + getDescriptorForType().hashCode();\n";
  }
  io::Printer::Print(printer,text);
  pDVar5 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    lVar7 = 0;
    lVar10 = 0;
    do {
      if (*(long *)(*(long *)(pDVar5 + 0x30) + 0x60 + lVar7) == 0) {
        pFVar8 = (FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar7);
        pFVar2 = Context::GetFieldGeneratorInfo(this->context_,pFVar8);
        bVar1 = anon_unknown_19::CheckHasBitsForEqualsAndHashCode(pFVar8);
        if (bVar1) {
          io::Printer::Print(printer,"if (has$name$()) {\n","name",&pFVar2->capitalized_name);
          io::Printer::Indent(printer);
          pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,pFVar8);
          (*pIVar3->_vptr_ImmutableFieldGenerator[0x12])(pIVar3,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
        }
        else {
          pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,pFVar8);
          (*pIVar3->_vptr_ImmutableFieldGenerator[0x12])(pIVar3,printer);
        }
      }
      lVar10 = lVar10 + 1;
      pDVar5 = (this->super_MessageGenerator).descriptor_;
      lVar7 = lVar7 + 0xa8;
    } while (lVar10 < *(int *)(pDVar5 + 0x2c));
  }
  pDVar5 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar5 + 0x38)) {
    lVar7 = 0;
    do {
      pOVar4 = Context::GetOneofGeneratorInfo
                         (this->context_,
                          (OneofDescriptor *)(*(long *)(pDVar5 + 0x40) + lVar7 * 0x30));
      io::Printer::Print(printer,"switch ($oneof_name$Case_) {\n","oneof_name",&pOVar4->name);
      io::Printer::Indent(printer);
      lVar10 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x40);
      if (0 < *(int *)(lVar10 + 0x1c + lVar7 * 0x30)) {
        lVar9 = 0;
        uVar6 = extraout_RDX_01;
        do {
          pFVar8 = *(FieldDescriptor **)(*(long *)(lVar10 + 0x20 + lVar7 * 0x30) + lVar9 * 8);
          SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(pFVar8 + 0x38),(int)uVar6);
          io::Printer::Print(printer,"case $field_number$:\n","field_number",&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,pFVar8);
          (*pIVar3->_vptr_ImmutableFieldGenerator[0x12])(pIVar3,printer);
          io::Printer::Print(printer,"break;\n");
          io::Printer::Outdent(printer);
          lVar9 = lVar9 + 1;
          lVar10 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x40);
          uVar6 = extraout_RDX_02;
        } while (lVar9 < *(int *)(lVar10 + 0x1c + lVar7 * 0x30));
      }
      io::Printer::Print(printer,"case 0:\ndefault:\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      lVar7 = lVar7 + 1;
      pDVar5 = (this->super_MessageGenerator).descriptor_;
    } while (lVar7 < *(int *)(pDVar5 + 0x38));
  }
  if (0 < *(int *)(pDVar5 + 0x68)) {
    io::Printer::Print(printer,"hash = hashFields(hash, getExtensionFields());\n");
  }
  io::Printer::Print(printer,"hash = (29 * hash) + unknownFields.hashCode();\n");
  io::Printer::Print(printer,"memoizedHashCode = hash;\nreturn hash;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateEqualsAndHashCode(io::Printer* printer) {
  printer->Print(
    "@java.lang.Override\n"
    "public boolean equals(final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
    "if (obj == this) {\n"
    " return true;\n"
    "}\n"
    "if (!(obj instanceof $classname$)) {\n"
    "  return super.equals(obj);\n"
    "}\n"
    "$classname$ other = ($classname$) obj;\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print("boolean result = true;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() == NULL) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
          "result = result && (has$name$() == other.has$name$());\n"
          "if (has$name$()) {\n",
          "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print(
          "}\n");
      }
    }
  }

  // Compare oneofs.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "result = result && get$oneof_capitalized_name$Case().equals(\n"
      "    other.get$oneof_capitalized_name$Case());\n",
      "oneof_capitalized_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->capitalized_name);
    printer->Print(
      "if (!result) return false;\n"
      "switch ($oneof_name$Case_) {\n",
      "oneof_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "case $field_number$:\n",
        "field_number",
        SimpleItoa(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
      "case 0:\n"
      "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    // Always consider unknown fields for equality. This will sometimes return
    // false for non-canonical ordering when running in LITE_RUNTIME but it's
    // the best we can do.
    printer->Print(
      "result = result && unknownFields.equals(other.unknownFields);\n");
  }
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "result = result &&\n"
      "    getExtensionFields().equals(other.getExtensionFields());\n");
  }
  printer->Print(
    "return result;\n");
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  printer->Print(
    "@java.lang.Override\n"
    "public int hashCode() {\n");
  printer->Indent();
  printer->Print(
    "if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print(
    "return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
    "}\n"
    "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() == NULL) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
          "if (has$name$()) {\n",
          "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "switch ($oneof_name$Case_) {\n",
      "oneof_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "case $field_number$:\n",
        "field_number",
        SimpleItoa(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
      "case 0:\n"
      "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print(
    "hash = (29 * hash) + unknownFields.hashCode();\n");
  printer->Print(
    "memoizedHashCode = hash;\n"
    "return hash;\n");
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");
}